

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

int lj_ir_numcmp(lua_Number a,lua_Number b,IROp op)

{
  IROp op_local;
  lua_Number b_local;
  lua_Number a_local;
  
  switch(op) {
  case IR_LT:
    a_local._4_4_ = (uint)(a < b);
    break;
  case IR_GE:
    a_local._4_4_ = (uint)(b <= a);
    break;
  case IR_LE:
    a_local._4_4_ = (uint)(a <= b);
    break;
  case IR_GT:
    a_local._4_4_ = (uint)(b < a);
    break;
  case IR_ULT:
    a_local._4_4_ = (uint)((b <= a ^ 0xffU) & 1);
    break;
  case IR_UGE:
    a_local._4_4_ = (uint)((a < b ^ 0xffU) & 1);
    break;
  case IR_ULE:
    a_local._4_4_ = (uint)((b < a ^ 0xffU) & 1);
    break;
  case IR_UGT:
    a_local._4_4_ = (uint)((a <= b ^ 0xffU) & 1);
    break;
  case IR_EQ:
    a_local._4_4_ = (uint)(a == b);
    break;
  case IR_NE:
    a_local._4_4_ = (uint)(a != b);
    break;
  default:
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int lj_ir_numcmp(lua_Number a, lua_Number b, IROp op)
{
  switch (op) {
  case IR_EQ: return (a == b);
  case IR_NE: return (a != b);
  case IR_LT: return (a < b);
  case IR_GE: return (a >= b);
  case IR_LE: return (a <= b);
  case IR_GT: return (a > b);
  case IR_ULT: return !(a >= b);
  case IR_UGE: return !(a < b);
  case IR_ULE: return !(a > b);
  case IR_UGT: return !(a <= b);
  default: lj_assertX(0, "bad IR op %d", op); return 0;
  }
}